

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O1

void Gia_ManCollectAnds(Gia_Man_t *p,int *pNodes,int nNodes,Vec_Int_t *vNodes,Vec_Int_t *vLeaves)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  ulong uVar4;
  int iObj;
  long lVar5;
  ulong uVar6;
  
  if (p->nTravIdsAlloc < 1) {
LAB_00724d56:
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
  }
  piVar1 = p->pTravIds;
  *piVar1 = p->nTravIds;
  if ((vLeaves != (Vec_Int_t *)0x0) && (0 < vLeaves->nSize)) {
    piVar2 = vLeaves->pArray;
    lVar5 = 0;
    do {
      if (p->nTravIdsAlloc <= piVar2[lVar5]) goto LAB_00724d56;
      piVar1[piVar2[lVar5]] = p->nTravIds;
      lVar5 = lVar5 + 1;
    } while (lVar5 < vLeaves->nSize);
  }
  vNodes->nSize = 0;
  if (0 < nNodes) {
    uVar6 = 0;
    do {
      iObj = pNodes[uVar6];
      if (((long)iObj < 0) || (p->nObjs <= iObj)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar3 = (uint)*(ulong *)(p->pObjs + iObj);
      uVar4 = *(ulong *)(p->pObjs + iObj) & 0x1fffffff;
      if (uVar4 == 0x1fffffff || -1 < (int)uVar3) {
        if (-1 < (int)uVar3 && (int)uVar4 != 0x1fffffff) goto LAB_00724d15;
      }
      else {
        iObj = iObj - (uVar3 & 0x1fffffff);
LAB_00724d15:
        Gia_ManCollectAnds_rec(p,iObj,vNodes);
      }
      uVar6 = uVar6 + 1;
    } while ((uint)nNodes != uVar6);
  }
  return;
}

Assistant:

void Gia_ManCollectAnds( Gia_Man_t * p, int * pNodes, int nNodes, Vec_Int_t * vNodes, Vec_Int_t * vLeaves )
{
    int i, iLeaf; 
//    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrentId( p, 0 );
    if ( vLeaves )
        Vec_IntForEachEntry( vLeaves, iLeaf, i )
            Gia_ObjSetTravIdCurrentId( p, iLeaf );
    Vec_IntClear( vNodes );
    for ( i = 0; i < nNodes; i++ )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, pNodes[i] );
        if ( Gia_ObjIsCo(pObj) )
            Gia_ManCollectAnds_rec( p, Gia_ObjFaninId0(pObj, pNodes[i]), vNodes );
        else if ( Gia_ObjIsAnd(pObj) )
            Gia_ManCollectAnds_rec( p, pNodes[i], vNodes );
    }
}